

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar5;
  int *piVar6;
  JBLOCKROW paJVar7;
  jpeg_error_mgr *pjVar8;
  JOCTET *pJVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  pjVar5 = cinfo->dest;
  entropy->next_output_byte = pjVar5->next_output_byte;
  entropy->free_in_buffer = pjVar5->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar3 = cinfo->Se;
  lVar19 = (long)cinfo->Ss;
  if (cinfo->Ss <= iVar3) {
    iVar4 = cinfo->Al;
    piVar6 = cinfo->natural_order;
    paJVar7 = *MCU_data;
    iVar12 = 0;
    do {
      sVar2 = (*paJVar7)[piVar6[lVar19]];
      if (sVar2 == 0) {
LAB_00115850:
        iVar12 = iVar12 + 1;
      }
      else {
        bVar13 = (byte)iVar4;
        uVar14 = (uint)-(int)sVar2 >> (bVar13 & 0x1f);
        uVar15 = (uint)(int)sVar2 >> (bVar13 & 0x1f);
        uVar11 = uVar15;
        if (sVar2 < 0) {
          uVar15 = uVar14;
          uVar11 = ~uVar14;
        }
        if (uVar15 == 0) goto LAB_00115850;
        if (entropy->EOBRUN != 0) {
          emit_eobrun(entropy);
        }
        iVar17 = iVar12;
        if (0xf < iVar12) {
          do {
            emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
            iVar12 = iVar17 + -0x10;
            bVar10 = 0x1f < iVar17;
            iVar17 = iVar12;
          } while (bVar10);
        }
        uVar14 = 1;
        if (uVar15 != 1) {
          uVar14 = 1;
          uVar16 = (ulong)uVar15;
          do {
            uVar14 = uVar14 + 1;
            uVar15 = (uint)uVar16;
            uVar16 = uVar16 >> 1;
          } while (3 < uVar15);
        }
        if (10 < uVar14) {
          pjVar8 = cinfo->err;
          pjVar8->msg_code = 6;
          (*pjVar8->error_exit)((j_common_ptr)cinfo);
        }
        emit_ac_symbol(entropy,entropy->ac_tbl_no,iVar12 * 0x10 + uVar14);
        iVar12 = 0;
        if (entropy->gather_statistics == 0) {
          iVar17 = uVar14 + (entropy->saved).put_bits;
          uVar16 = (ulong)(~(uint)(-1L << ((byte)uVar14 & 0x3f)) & uVar11) <<
                   (0x18U - (char)iVar17 & 0x3f) | (entropy->saved).put_buffer;
          iVar18 = iVar17;
          if (7 < iVar17) {
            do {
              pJVar9 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar9 + 1;
              *pJVar9 = (JOCTET)(uVar16 >> 0x10);
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
              if ((~(uint)uVar16 & 0xff0000) == 0) {
                pJVar9 = entropy->next_output_byte;
                entropy->next_output_byte = pJVar9 + 1;
                *pJVar9 = '\0';
                psVar1 = &entropy->free_in_buffer;
                *psVar1 = *psVar1 - 1;
                if (*psVar1 == 0) {
                  dump_buffer_e(entropy);
                }
              }
              uVar16 = uVar16 << 8;
              iVar17 = iVar18 + -8;
              bVar10 = 0xf < iVar18;
              iVar18 = iVar17;
            } while (bVar10);
          }
          (entropy->saved).put_buffer = uVar16;
          (entropy->saved).put_bits = iVar17;
        }
      }
      lVar19 = lVar19 + 1;
    } while (iVar3 + 1 != (int)lVar19);
    if ((0 < iVar12) && (uVar15 = entropy->EOBRUN + 1, entropy->EOBRUN = uVar15, uVar15 == 0x7fff))
    {
      emit_eobrun(entropy);
    }
  }
  pjVar5 = cinfo->dest;
  pjVar5->next_output_byte = entropy->next_output_byte;
  pjVar5->free_in_buffer = entropy->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
    }
    entropy->restarts_to_go = entropy->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  register int r, k;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */
  
  r = 0;			/* r = run length of zeros */
   
  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = (*block)[natural_order[k]]) == 0) {
      r++;
      continue;
    }
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value; so the code is
     * interwoven with finding the abs value (temp) and output bits (temp2).
     */
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      temp >>= Al;		/* apply the point transform */
      /* For a negative coef, want temp2 = bitwise complement of abs(coef) */
      temp2 = ~temp;
    } else {
      temp >>= Al;		/* apply the point transform */
      temp2 = temp;
    }
    /* Watch out for case that nonzero coef is zero after point transform */
    if (temp == 0) {
      r++;
      continue;
    }

    /* Emit any pending EOBRUN */
    if (entropy->EOBRUN > 0)
      emit_eobrun(entropy);
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */
    while (r > 15) {
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
    }

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 1;			/* there must be at least one 1 bit */
    while ((temp >>= 1))
      nbits++;
    /* Check for out-of-range coefficient values */
    if (nbits > MAX_COEF_BITS)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    emit_bits_e(entropy, (unsigned int) temp2, nbits);

    r = 0;			/* reset zero run length */
  }

  if (r > 0) {			/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);	/* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}